

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

int update_demo_menu(DEMO_MENU *menu)

{
  DEMO_MENU *pDVar1;
  _func_int_DEMO_MENU_ptr_int_int *p_Var2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  DEMO_MENU *pDVar8;
  bool bVar9;
  
  update_background();
  update_credits();
  lVar7 = (long)selected_item;
  if (lVar7 != -1) {
    (*menu[lVar7].proc)(menu + lVar7,3,0);
  }
  p_Var2 = menu->proc;
  pDVar8 = menu;
  while (p_Var2 != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar4 = (*p_Var2)(pDVar8,6,0);
    if (iVar4 == 0x3ea) {
      locked = '\0';
      return 1000;
    }
    pDVar1 = pDVar8 + 1;
    pDVar8 = pDVar8 + 1;
    p_Var2 = pDVar1->proc;
  }
  if (locked == '\0') {
    _Var3 = key_pressed(0x3b);
    if (_Var3) {
      return 0x3e9;
    }
    _Var3 = mouse_button_pressed(1);
    if ((_Var3) && (menu->proc != (_func_int_DEMO_MENU_ptr_int_int *)0x0)) {
      iVar4 = 0;
      pDVar8 = menu;
      do {
        iVar5 = mouse_x();
        if ((((pDVar8->x <= iVar5) && (iVar5 = mouse_y(), pDVar8->y <= iVar5)) &&
            (iVar5 = mouse_x(), iVar5 < pDVar8->w + pDVar8->x)) &&
           ((iVar5 = mouse_y(), iVar5 < pDVar8->h + pDVar8->y &&
            (uVar6 = pDVar8->flags, (uVar6 & 1) != 0)))) {
          if ((long)selected_item != -1) {
            *(byte *)&menu[selected_item].flags = (byte)menu[selected_item].flags & 0xfd;
            uVar6 = pDVar8->flags;
          }
          selected_item = iVar4;
          pDVar8->flags = uVar6 | 2;
          play_sound_id(7,0xff,0x80,-100,0);
          iVar4 = (*pDVar8->proc)(pDVar8,2,0xd);
          return iVar4;
        }
        iVar4 = iVar4 + 1;
        pDVar1 = pDVar8 + 1;
        pDVar8 = pDVar8 + 1;
      } while (pDVar1->proc != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
    }
    _Var3 = key_pressed(0x54);
    if (selected_item != -1 && _Var3) {
      lVar7 = (long)selected_item;
      iVar4 = selected_item;
      do {
        if (iVar4 < 1) {
          iVar4 = item_count;
        }
        iVar4 = iVar4 + -1;
      } while ((menu[iVar4].flags & 1) == 0);
      bVar9 = selected_item != iVar4;
      selected_item = iVar4;
      if (bVar9) {
        *(byte *)&menu[lVar7].flags = (byte)menu[lVar7].flags & 0xfd;
        *(byte *)&menu[iVar4].flags = (byte)menu[iVar4].flags | 2;
        play_sound_id(7,0xff,0x80,-100,0);
      }
    }
    _Var3 = key_pressed(0x55);
    if (selected_item != -1 && _Var3) {
      lVar7 = (long)selected_item;
      iVar4 = selected_item;
      do {
        iVar4 = iVar4 + 1;
        if (item_count <= iVar4) {
          iVar4 = 0;
        }
      } while ((menu[iVar4].flags & 1) == 0);
      bVar9 = selected_item != iVar4;
      selected_item = iVar4;
      if (bVar9) {
        *(byte *)&menu[lVar7].flags = (byte)menu[lVar7].flags & 0xfd;
        *(byte *)&menu[iVar4].flags = (byte)menu[iVar4].flags | 2;
        play_sound_id(7,0xff,0x80,-100,0);
      }
    }
    iVar5 = unicode_char(true);
    _Var3 = gamepad_button();
    iVar4 = 0x20;
    if (!_Var3) {
      iVar4 = iVar5;
    }
    lVar7 = (long)selected_item;
    if (iVar4 != 0 && lVar7 != -1) {
      iVar4 = (*menu[lVar7].proc)(menu + lVar7,2,iVar4);
      if (iVar4 != 0x3ea) {
        locked = '\0';
        return iVar4;
      }
      locked = '\x01';
    }
  }
  return 1000;
}

Assistant:

int update_demo_menu(DEMO_MENU * menu)
{
   int tmp, c;

   update_background();
   update_credits();
   
   if (selected_item != -1) {
      menu[selected_item].proc(&menu[selected_item], DEMO_MENU_MSG_KEY, 0);
   }

   for (tmp = 0; menu[tmp].proc != 0; tmp++) {
      if (menu[tmp].proc(&menu[tmp], DEMO_MENU_MSG_TICK, 0) == DEMO_MENU_LOCK) {
         locked = 0;
         return DEMO_MENU_CONTINUE;
      }
   }

   if (locked == 1) {
      return DEMO_MENU_CONTINUE;
   }

   if (key_pressed(ALLEGRO_KEY_ESCAPE)) {
      return DEMO_MENU_BACK;
   }
   
   /* If a mouse button is pressed, select the item under it and send a
    * DEMO_MENU_MSG_CHAR with 13 to it (which is the same effect as hitting
    * the return key).
    */
   if (mouse_button_pressed(1)) {
      int i;
      for (i = 0; menu[i].proc != NULL; i++) {
         if (mouse_x() >= menu[i].x && mouse_y() >= menu[i].y &&
               mouse_x() < menu[i].x + menu[i].w &&
               mouse_y() < menu[i].y + menu[i].h) {
            if (menu[i].flags & DEMO_MENU_SELECTABLE) {
               if (selected_item != -1) {
                  menu[selected_item].flags &= ~DEMO_MENU_SELECTED;
               }
               selected_item = i;
               menu[i].flags |= DEMO_MENU_SELECTED;
               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
               return menu[i].proc(&menu[i], DEMO_MENU_MSG_CHAR, 13);
            }
         }
      }
   }

   if (key_pressed(ALLEGRO_KEY_UP)) {
      if (selected_item != -1) {
         tmp = selected_item;

         while (1) {
            --selected_item;
            if (selected_item < 0) {
               selected_item = item_count - 1;
            }

            if (menu[selected_item].flags & DEMO_MENU_SELECTABLE) {
               break;
            }
         }

         if (tmp != selected_item) {
            menu[tmp].flags &= ~DEMO_MENU_SELECTED;
            menu[selected_item].flags |= DEMO_MENU_SELECTED;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation,
                       0);
         }
      }
   }
    
   if (key_pressed(ALLEGRO_KEY_DOWN)) {
      if (selected_item != -1) {
         tmp = selected_item;

         while (1) {
            ++selected_item;
            if (selected_item >= item_count) {
               selected_item = 0;
            }

            if (menu[selected_item].flags & DEMO_MENU_SELECTABLE) {
               break;
            }
         }

         if (tmp != selected_item) {
            menu[tmp].flags &= ~DEMO_MENU_SELECTED;
            menu[selected_item].flags |= DEMO_MENU_SELECTED;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation,
                       0);
         }
      }
   }
    
    c = unicode_char(true);
    if(gamepad_button()) {
        c = 32;
    }

   if (selected_item != -1 && c) {
      tmp = menu[selected_item].proc(&menu[selected_item],
         DEMO_MENU_MSG_CHAR, c);
      if (tmp == DEMO_MENU_LOCK) {
         locked = 1;
         return DEMO_MENU_CONTINUE;
      } else {
         locked = 0;
         return tmp;
      }
   }

   return DEMO_MENU_CONTINUE;
}